

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TVP.cpp
# Opt level: O0

void __thiscall MT32Emu::TVP::targetPitchOffsetReached(TVP *this)

{
  short sVar1;
  byte bVar2;
  short local_14;
  int targetPitchOffset;
  int newLFOPitchOffset;
  TVP *this_local;
  
  this->currentPitchOffset = this->targetPitchOffsetWithoutLFO + (int)this->lfoPitchOffset;
  if (this->phase - 3U < 2) {
    bVar2 = Part::getModulation(this->part);
    sVar1 = (short)((int)((uint)bVar2 * (uint)(this->partialParam->pitchLFO).modSensitivity) >> 7) +
            (ushort)(this->partialParam->pitchLFO).depth;
    local_14 = sVar1 * 2;
    if (0 < this->pitchOffsetChangePerBigTick) {
      local_14 = sVar1 * -2;
    }
    this->lfoPitchOffset = local_14;
    setupPitchChange(this,this->targetPitchOffsetWithoutLFO + (int)this->lfoPitchOffset,
                     'e' - (this->partialParam->pitchLFO).rate);
    updatePitch(this);
  }
  else if (this->phase == 6) {
    updatePitch(this);
  }
  else {
    nextPhase(this);
  }
  return;
}

Assistant:

void TVP::targetPitchOffsetReached() {
	currentPitchOffset = targetPitchOffsetWithoutLFO + lfoPitchOffset;

	switch (phase) {
	case 3:
	case 4:
	{
		int newLFOPitchOffset = (part->getModulation() * partialParam->pitchLFO.modSensitivity) >> 7;
		newLFOPitchOffset = (newLFOPitchOffset + partialParam->pitchLFO.depth) << 1;
		if (pitchOffsetChangePerBigTick > 0) {
			// Go in the opposite direction to last time
			newLFOPitchOffset = -newLFOPitchOffset;
		}
		lfoPitchOffset = newLFOPitchOffset;
		int targetPitchOffset = targetPitchOffsetWithoutLFO + lfoPitchOffset;
		setupPitchChange(targetPitchOffset, 101 - partialParam->pitchLFO.rate);
		updatePitch();
		break;
	}
	case 6:
		updatePitch();
		break;
	default:
		nextPhase();
	}
}